

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

Sequence * __thiscall kratos::Sequence::imply(Sequence *this,shared_ptr<kratos::Var> *var)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<kratos::Sequence> local_28;
  shared_ptr<kratos::Var> *local_18;
  shared_ptr<kratos::Var> *var_local;
  Sequence *this_local;
  
  local_18 = var;
  var_local = (shared_ptr<kratos::Var> *)this;
  std::make_shared<kratos::Sequence,std::shared_ptr<kratos::Var>const&>
            ((shared_ptr<kratos::Var> *)&local_28);
  std::shared_ptr<kratos::Sequence>::operator=(&this->next_,&local_28);
  std::shared_ptr<kratos::Sequence>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->next_);
  peVar1->parent_ = this;
  peVar2 = std::__shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->next_).
                       super___shared_ptr<kratos::Sequence,_(__gnu_cxx::_Lock_policy)2>);
  return peVar2;
}

Assistant:

Sequence *Sequence::imply(const std::shared_ptr<Var> &var) {
    next_ = std::make_shared<Sequence>(var);
    next_->parent_ = this;
    return next_.get();
}